

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,vector<int,_std::allocator<int>_> *data,bool update,
          int offset,int size)

{
  bool bVar1;
  __type _Var2;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  invalid_argument *piVar7;
  byte in_CL;
  vector<int,_std::allocator<int>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  GLShaderAttribute *a;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
  *__range2;
  uint i;
  vector<int,_std::allocator<int>_> intData;
  vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
  *in_stack_fffffffffffffe38;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>_>
  *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  value_type in_stack_fffffffffffffe4c;
  allocator_type *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  string local_98 [32];
  reference local_78;
  GLShaderAttribute *local_70;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>_>
  local_68;
  size_type *local_60;
  uint local_58;
  undefined1 local_41 [29];
  int local_24;
  int local_20;
  byte local_19;
  vector<int,_std::allocator<int>_> *local_18;
  
  local_19 = in_CL & 1;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_18 = in_RDX;
  geometrycentral::surface::std::vector<int,_std::allocator<int>_>::size(in_RDX);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
  geometrycentral::surface::std::allocator<int>::allocator((allocator<int> *)0x4007e0);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)in_RSI,in_stack_fffffffffffffe50
            );
  geometrycentral::surface::std::allocator<int>::~allocator((allocator<int> *)0x400806);
  local_58 = 0;
  while( true ) {
    this_00 = (vector<int,_std::allocator<int>_> *)(ulong)local_58;
    pvVar3 = (vector<int,_std::allocator<int>_> *)
             geometrycentral::surface::std::vector<int,_std::allocator<int>_>::size(local_18);
    if (pvVar3 <= this_00) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_18,(ulong)local_58);
    in_stack_fffffffffffffe4c = *pvVar4;
    pvVar5 = geometrycentral::surface::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_41 + 1),(ulong)local_58);
    *pvVar5 = in_stack_fffffffffffffe4c;
    local_58 = local_58 + 1;
  }
  local_60 = &in_RDI[2]._M_string_length;
  local_68._M_current =
       (GLShaderAttribute *)
       std::
       vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
       ::begin(in_stack_fffffffffffffe38);
  local_70 = (GLShaderAttribute *)
             std::
             vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
             ::end(in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffe40,
                       (__normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) {
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     in_stack_fffffffffffffe80);
      std::invalid_argument::invalid_argument(piVar7,(string *)&stack0xfffffffffffffe80);
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_78 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>_>
               ::operator*(&local_68);
    _Var2 = std::operator==(in_RDI,in_RSI);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>_>
    ::operator++(&local_68);
  }
  if (local_78->type != Int) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   in_stack_fffffffffffffe80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),(char *)piVar7);
    std::__cxx11::to_string(in_stack_fffffffffffffe8c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),(char *)piVar7);
    std::__cxx11::to_string(in_stack_fffffffffffffe8c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),__rhs);
    std::invalid_argument::invalid_argument(piVar7,local_98);
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((local_19 & 1) == 0) {
    sVar6 = geometrycentral::surface::std::vector<int,_std::allocator<int>_>::size(local_18);
    local_78->dataSize = sVar6;
  }
  else {
    local_20 = local_20 << 2;
    if (local_24 == -1) {
      local_24 = (int)(local_78->dataSize << 2);
    }
    else {
      local_24 = local_24 << 2;
    }
  }
  geometrycentral::surface::std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return;
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, const std::vector<int>& data, bool update, int offset, int size) {
  // FIXME I've seen strange bugs when using int's in shaders. Need to figure
  // out it it's my shaders or something wrong with this function

  // Convert data to GL_INT (probably does nothing)
  std::vector<int> intData(data.size());
  for (unsigned int i = 0; i < data.size(); i++) {
    intData[i] = static_cast<int>(data[i]);
  }

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {
      if (a.type == DataType::Int) {
        if (update) {
          // TODO: Allow modifications to non-contiguous memory
          offset *= sizeof(int);
          if (size == -1)
            size = a.dataSize * sizeof(int);
          else
            size *= sizeof(int);

        } else {
          a.dataSize = data.size();
        }
      } else {
        throw std::invalid_argument("Tried to set GLShaderAttribute named " + name +
                                    " with wrong type. Actual type: " + std::to_string(static_cast<int>(a.type)) +
                                    "  Attempted type: " + std::to_string(static_cast<int>(DataType::Int)));
      }
      return;
    }
  }

  throw std::invalid_argument("No attribute with name " + name);
}